

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::MinMaxState<unsigned_int>,unsigned_int,duckdb::MinOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  uint uVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  byte bVar9;
  unsigned_long uVar10;
  idx_t iVar11;
  ulong uVar12;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar5 = 0;
      uVar6 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = puVar2[uVar5];
        }
        uVar12 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar12 = count;
        }
        uVar7 = uVar12;
        if (uVar10 != 0) {
          uVar7 = uVar6;
          if (uVar10 == 0xffffffffffffffff) {
            if (uVar6 < uVar12) {
              bVar9 = state[4];
              do {
                uVar1 = *(uint *)(pdVar3 + uVar7 * 4);
                if ((bVar9 & 1) == 0) {
                  *(uint *)state = uVar1;
                  state[4] = '\x01';
                  bVar9 = 1;
                }
                else if (uVar1 < *(uint *)state) {
                  *(uint *)state = uVar1;
                }
                uVar7 = uVar7 + 1;
              } while (uVar12 != uVar7);
            }
          }
          else if (uVar6 < uVar12) {
            uVar7 = 0;
            do {
              if ((uVar10 >> (uVar7 & 0x3f) & 1) != 0) {
                uVar1 = *(uint *)(pdVar3 + uVar7 * 4 + uVar6 * 4);
                if (state[4] == '\0') {
                  *(uint *)state = uVar1;
                  state[4] = '\x01';
                }
                else if (uVar1 < *(uint *)state) {
                  *(uint *)state = uVar1;
                }
              }
              uVar7 = uVar7 + 1;
            } while ((uVar6 - uVar12) + uVar7 != 0);
            uVar7 = uVar6 + uVar7;
          }
        }
        uVar5 = uVar5 + 1;
        uVar6 = uVar7;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      uVar1 = *(uint *)input->data;
      if (state[4] == '\0') {
        *(uint *)state = uVar1;
        state[4] = '\x01';
      }
      else if (uVar1 < *(uint *)state) {
        *(uint *)state = uVar1;
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_68.sel)->sel_vector;
        bVar9 = state[4];
        iVar8 = 0;
        do {
          iVar11 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar4[iVar8];
          }
          uVar1 = *(uint *)(local_68.data + iVar11 * 4);
          if ((bVar9 & 1) == 0) {
            *(uint *)state = uVar1;
            state[4] = '\x01';
            bVar9 = 1;
          }
          else if (uVar1 < *(uint *)state) {
            *(uint *)state = uVar1;
          }
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
      }
    }
    else if (count != 0) {
      psVar4 = (local_68.sel)->sel_vector;
      iVar8 = 0;
      do {
        iVar11 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar4[iVar8];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
             >> (iVar11 & 0x3f) & 1) != 0) {
          uVar1 = *(uint *)(local_68.data + iVar11 * 4);
          if (state[4] == '\0') {
            *(uint *)state = uVar1;
            state[4] = '\x01';
          }
          else if (uVar1 < *(uint *)state) {
            *(uint *)state = uVar1;
          }
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}